

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_damagescreencolor_Cfs_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  bool bVar1;
  double dVar2;
  uint32 local_50;
  FName local_4c;
  char *local_48;
  char *type;
  double a_1;
  double a;
  PalEntry color;
  int c;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  APlayerPawn *defaults_local;
  
  _color = params;
  if (params[1].i == 0) {
    local_50 = params[2].i;
  }
  else {
    local_50 = V_GetColor((DWORD *)0x0,params[2].s,(FScriptPosition *)0x0);
  }
  a._4_4_ = local_50;
  PalEntry::PalEntry((PalEntry *)&a,local_50);
  if (_color->i < 3) {
    a._0_4_ = (anon_union_4_2_12391d7c_for_PalEntry_0)CONCAT13(0xff,a._0_3_);
    (defaults->DamageFade).field_0 = a._0_4_;
  }
  else if (_color->i < 4) {
    a_1 = _color[3].d;
    dVar2 = clamp<double>(a_1,0.0,1.0);
    a._0_4_ = (anon_union_4_2_12391d7c_for_PalEntry_0)CONCAT13((char)(int)(dVar2 * 255.0),a._0_3_);
    (defaults->DamageFade).field_0 = a._0_4_;
  }
  else {
    type = _color[3].s;
    local_48 = _color[4].s;
    dVar2 = clamp<double>((double)type,0.0,1.0);
    a._0_4_ = (anon_union_4_2_12391d7c_for_PalEntry_0)CONCAT13((char)(int)(dVar2 * 255.0),a._0_3_);
    bVar1 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0xb3d,
                    "void Handler_damagescreencolor_Cfs_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                   );
    }
    FName::FName(&local_4c,local_48);
    TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::Insert
              ((TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_> *)
               &info[1].super_PClass.SpecialInits,&local_4c,(PalEntry *)&a);
  }
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, damagescreencolor, Cfs, PlayerPawn)
{
	PROP_COLOR_PARM(c, 0);

	PalEntry color = c;

	if (PROP_PARM_COUNT < 3)		// Because colors count as 2 parms
	{
		color.a = 255;
		defaults->DamageFade = color;
	}
	else if (PROP_PARM_COUNT < 4)
	{
		PROP_DOUBLE_PARM(a, 2);

		color.a = BYTE(255 * clamp<double>(a, 0.f, 1.f));
		defaults->DamageFade = color;
	}
	else
	{
		PROP_DOUBLE_PARM(a, 2);
		PROP_STRING_PARM(type, 3);

		color.a = BYTE(255 * clamp<double>(a, 0.f, 1.f));
		assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
		static_cast<PClassPlayerPawn *>(info)->PainFlashes.Insert(type, color);
	}
}